

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O0

void ourWriteOutJSON(FILE *stream,writeoutvar *mappings,size_t nentries,per_transfer *per,
                    CURLcode per_result)

{
  int iVar1;
  char *in;
  ulong local_38;
  size_t i;
  CURLcode per_result_local;
  per_transfer *per_local;
  size_t nentries_local;
  writeoutvar *mappings_local;
  FILE *stream_local;
  
  fputs("{",(FILE *)stream);
  for (local_38 = 0; local_38 < nentries; local_38 = local_38 + 1) {
    if (mappings[local_38].writefunc !=
        (_func_int_FILE_ptr_writeoutvar_ptr_per_transfer_ptr_CURLcode__Bool *)0x0) {
      iVar1 = (*mappings[local_38].writefunc)(stream,mappings + local_38,per,per_result,true);
      if (iVar1 != 0) {
        fputs(",",(FILE *)stream);
      }
    }
  }
  curl_mfprintf(stream,"\"curl_version\":");
  in = (char *)curl_version();
  jsonWriteString(stream,in,false);
  curl_mfprintf(stream,"}");
  return;
}

Assistant:

void ourWriteOutJSON(FILE *stream, const struct writeoutvar mappings[],
                     size_t nentries,
                     struct per_transfer *per, CURLcode per_result)
{
  size_t i;

  fputs("{", stream);

  for(i = 0; i < nentries; i++) {
    if(mappings[i].writefunc &&
       mappings[i].writefunc(stream, &mappings[i], per, per_result, true))
      fputs(",", stream);
  }

  /* The variables are sorted in alphabetical order but as a special case
     curl_version (which is not actually a --write-out variable) is last. */
  fprintf(stream, "\"curl_version\":");
  jsonWriteString(stream, curl_version(), FALSE);
  fprintf(stream, "}");
}